

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O2

void OpenSteer::
     mapPointToPathAlike<OpenSteer::PolylineSegmentedPathwaySegmentRadii,(anonymous_namespace)::PointToSegmentIndexMapping>
               (PolylineSegmentedPathwaySegmentRadii *pathAlike,Vec3 *point,
               PointToSegmentIndexMapping *mapping)

{
  int iVar1;
  undefined4 extraout_var;
  size_type segmentIndex;
  size_type segmentIndex_00;
  Vec3 VVar2;
  float local_78;
  float distancePointToPath;
  float radius;
  float segmentDistance;
  PointToSegmentIndexMapping *local_68;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  local_68 = mapping;
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])();
  local_78 = 3.4028235e+38;
  for (segmentIndex_00 = 0; CONCAT44(extraout_var,iVar1) != segmentIndex_00;
      segmentIndex_00 = segmentIndex_00 + 1) {
    segmentDistance = 0.0;
    radius = 0.0;
    distancePointToPath = 0.0;
    local_40.x = 0.0;
    local_40.y = 0.0;
    local_40.z = 0.0;
    local_50.x = 0.0;
    local_50.y = 0.0;
    local_50.z = 0.0;
    PointToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySegmentRadii>::
    extract(pathAlike,segmentIndex_00,point,&segmentDistance,&radius,&distancePointToPath,&local_40,
            &local_50);
    VVar2.y = 0.0;
    VVar2.x = local_78;
    VVar2.z = distancePointToPath;
    if (distancePointToPath < local_78) {
      local_78 = distancePointToPath;
      local_60 = Vec3::operator-(point,&local_40);
      VVar2 = Vec3::normalize(&local_60);
      local_68->segmentIndex = segmentIndex_00;
    }
    (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])
              (VVar2._0_8_,VVar2.z,pathAlike,segmentIndex_00);
  }
  return;
}

Assistant:

void mapPointToPathAlike( PathAlike const& pathAlike, Vec3 const& point, Mapping& mapping ) {
        PointToPathAlikeMapping< PathAlike, Mapping >::map( pathAlike, point, mapping );
    }